

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O2

void snprint_insn_detail(char *buf,size_t *cur,size_t *left,cs_insn *ins)

{
  undefined8 uVar1;
  uint uVar2;
  arm64_shifter aVar3;
  cs_detail *pcVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *__s;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  
  pcVar4 = ins->detail;
  if (pcVar4 != (cs_detail *)0x0) {
    if ((pcVar4->field_6).arm.op_count != '\0') {
      iVar6 = snprintf(buf + *cur,*left,"\top_count: %u\n");
      *left = *left - (long)iVar6;
      *cur = *cur + (long)iVar6;
    }
    piVar11 = &(pcVar4->field_6).x86.operands[0].field_1.mem.scale;
    for (uVar10 = 0; uVar10 < (pcVar4->field_6).arm.op_count; uVar10 = uVar10 + 1) {
      uVar2 = piVar11[-4];
      switch(uVar2) {
      case 1:
        sVar8 = *cur;
        sVar5 = *left;
        pcVar7 = cs_reg_name(handle,((x86_op_mem *)(piVar11 + -3))->segment);
        iVar6 = snprintf(buf + sVar8,sVar5,"\t\toperands[%u].type: REG = %s\n",uVar10 & 0xffffffff,
                         pcVar7);
        break;
      case 2:
        __s = buf + *cur;
        sVar8 = *left;
        uVar9 = (ulong)((x86_op_mem *)(piVar11 + -3))->segment;
        pcVar7 = "\t\toperands[%u].type: IMM = 0x%x\n";
        goto LAB_00143905;
      case 3:
        iVar6 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: MEM\n",uVar10 & 0xffffffff);
        *left = *left - (long)iVar6;
        sVar8 = (long)iVar6 + *cur;
        *cur = sVar8;
        if (((x86_op_mem *)(piVar11 + -3))->segment != 0) {
          sVar5 = *left;
          pcVar7 = cs_reg_name(handle,((x86_op_mem *)(piVar11 + -3))->segment);
          iVar6 = snprintf(buf + sVar8,sVar5,"\t\t\toperands[%u].mem.base: REG = %s\n",
                           uVar10 & 0xffffffff,pcVar7);
          *left = *left - (long)iVar6;
          sVar8 = (long)iVar6 + *cur;
          *cur = sVar8;
        }
        if (piVar11[-2] != 0) {
          sVar5 = *left;
          pcVar7 = cs_reg_name(handle,piVar11[-2]);
          iVar6 = snprintf(buf + sVar8,sVar5,"\t\t\toperands[%u].mem.index: REG = %s\n",
                           uVar10 & 0xffffffff,pcVar7);
          *left = *left - (long)iVar6;
          sVar8 = (long)iVar6 + *cur;
          *cur = sVar8;
        }
        if (piVar11[-1] != 1) {
          iVar6 = snprintf(buf + sVar8,*left,"\t\t\toperands[%u].mem.scale: %u\n",
                           uVar10 & 0xffffffff);
          *left = *left - (long)iVar6;
          sVar8 = (long)iVar6 + *cur;
          *cur = sVar8;
        }
        uVar9 = (ulong)(uint)*piVar11;
        if (*piVar11 != 0) {
          __s = buf + sVar8;
          sVar8 = *left;
          pcVar7 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
          goto LAB_00143905;
        }
        goto LAB_00143917;
      case 4:
        uVar1._0_4_ = ((x86_op_mem *)(piVar11 + -3))->segment;
        uVar1._4_4_ = ((x86_op_mem *)(piVar11 + -3))->base;
        iVar6 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: FP = %f\n",uVar1,
                         uVar10 & 0xffffffff);
        break;
      default:
        if (uVar2 == 0x40) {
          __s = buf + *cur;
          sVar8 = *left;
          uVar9 = (ulong)((x86_op_mem *)(piVar11 + -3))->segment;
          pcVar7 = "\t\toperands[%u].type: C-IMM = %u\n";
        }
        else {
          if (uVar2 != 0x41) goto LAB_00143917;
          __s = buf + *cur;
          sVar8 = *left;
          uVar9 = (ulong)((x86_op_mem *)(piVar11 + -3))->segment;
          pcVar7 = "\t\toperands[%u].type: P-IMM = %u\n";
        }
LAB_00143905:
        iVar6 = snprintf(__s,sVar8,pcVar7,uVar10 & 0xffffffff,uVar9);
      }
      *left = *left - (long)iVar6;
      *cur = *cur + (long)iVar6;
LAB_00143917:
      uVar2 = piVar11[-6];
      if ((uVar2 != 0) && (piVar11[-5] != 0)) {
        sVar8 = *cur;
        sVar5 = *left;
        if (uVar2 < 6) {
          iVar6 = snprintf(buf + sVar8,sVar5,"\t\t\tShift: %u = %u\n",(ulong)uVar2);
        }
        else {
          pcVar7 = cs_reg_name(handle,piVar11[-5]);
          iVar6 = snprintf(buf + sVar8,sVar5,"\t\t\tShift: %u = %s\n",(ulong)uVar2,pcVar7);
        }
        *left = *left - (long)iVar6;
        *cur = *cur + (long)iVar6;
      }
      piVar11 = piVar11 + 10;
    }
    aVar3 = (pcVar4->field_6).arm64.operands[0].shift.type;
    if ((aVar3 != ARM64_SFT_INVALID) && (aVar3 != 0xf)) {
      iVar6 = snprintf(buf + *cur,*left,"\tCode condition: %u\n");
      *left = *left - (long)iVar6;
      *cur = *cur + (long)iVar6;
    }
    if ((pcVar4->field_6).arm.update_flags == true) {
      iVar6 = snprintf(buf + *cur,*left,"\tUpdate-flags: True\n");
      *left = *left - (long)iVar6;
      *cur = *cur + (long)iVar6;
    }
    if ((pcVar4->field_6).arm.writeback == true) {
      iVar6 = snprintf(buf + *cur,*left,"\tWrite-back: True\n");
      *left = *left - (long)iVar6;
      *cur = *cur + (long)iVar6;
    }
  }
  return;
}

Assistant:

static void snprint_insn_detail(char * buf, size_t * cur, size_t * left, cs_insn *ins)
{
	size_t used = 0;

#define _this_printf(...) \
	{ \
		size_t used = 0; \
		used = snprintf(buf + *cur, *left, __VA_ARGS__); \
		*left -= used; \
		*cur += used; \
	}

	cs_arm *arm;
	int i;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	arm = &(ins->detail->arm);

	if (arm->op_count)
		_this_printf("\top_count: %u\n", arm->op_count);

	for (i = 0; i < arm->op_count; i++) {
		cs_arm_op *op = &(arm->operands[i]);
		switch((int)op->type) {
			default:
				break;
			case ARM_OP_REG:
				_this_printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case ARM_OP_IMM:
				_this_printf("\t\toperands[%u].type: IMM = 0x%x\n", i, op->imm);
				break;
			case ARM_OP_FP:
				_this_printf("\t\toperands[%u].type: FP = %f\n", i, op->fp);
				break;
			case ARM_OP_MEM:
				_this_printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.base != X86_REG_INVALID)
					_this_printf("\t\t\toperands[%u].mem.base: REG = %s\n",
							i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != X86_REG_INVALID)
					_this_printf("\t\t\toperands[%u].mem.index: REG = %s\n",
							i, cs_reg_name(handle, op->mem.index));
				if (op->mem.scale != 1)
					_this_printf("\t\t\toperands[%u].mem.scale: %u\n", i, op->mem.scale);
				if (op->mem.disp != 0)
					_this_printf("\t\t\toperands[%u].mem.disp: 0x%x\n", i, op->mem.disp);

				break;
			case ARM_OP_PIMM:
				_this_printf("\t\toperands[%u].type: P-IMM = %u\n", i, op->imm);
				break;
			case ARM_OP_CIMM:
				_this_printf("\t\toperands[%u].type: C-IMM = %u\n", i, op->imm);
				break;
		}

		if (op->shift.type != ARM_SFT_INVALID && op->shift.value) {
			if (op->shift.type < ARM_SFT_ASR_REG) {
				// shift with constant value
				_this_printf("\t\t\tShift: %u = %u\n", op->shift.type, op->shift.value);
			} else {
				// shift with register
				_this_printf("\t\t\tShift: %u = %s\n", op->shift.type,
						cs_reg_name(handle, op->shift.value));
			}
		}
	}

	if (arm->cc != ARM_CC_AL && arm->cc != ARM_CC_INVALID) {
		_this_printf("\tCode condition: %u\n", arm->cc);
	}

	if (arm->update_flags) {
		_this_printf("\tUpdate-flags: True\n");
	}

	if (arm->writeback) {
		_this_printf("\tWrite-back: True\n");
	}

#undef _this_printf
}